

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_intervals.h
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
Gudhi::Persistence_representations::Persistence_intervals::cumulative_histogram_of_lengths
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          Persistence_intervals *this,size_t number_of_bins)

{
  pointer puVar1;
  unsigned_long uVar2;
  long lVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> histogram;
  allocator_type local_29;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  
  histogram_of_lengths
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_28,this,number_of_bins)
  ;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,
             (long)local_28._M_impl.super__Vector_impl_data._M_finish -
             (long)local_28._M_impl.super__Vector_impl_data._M_start >> 3,&local_29);
  puVar1 = (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = 0;
  for (lVar3 = 0;
      (long)local_28._M_impl.super__Vector_impl_data._M_finish -
      (long)local_28._M_impl.super__Vector_impl_data._M_start >> 3 != lVar3; lVar3 = lVar3 + 1) {
    uVar2 = uVar2 + local_28._M_impl.super__Vector_impl_data._M_start[lVar3];
    puVar1[lVar3] = uVar2;
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::vector<size_t> Persistence_intervals::cumulative_histogram_of_lengths(size_t number_of_bins) const {
  std::vector<size_t> histogram = this->histogram_of_lengths(number_of_bins);
  std::vector<size_t> result(histogram.size());

  size_t sum = 0;
  for (size_t i = 0; i != histogram.size(); ++i) {
    sum += histogram[i];
    result[i] = sum;
  }
  return result;
}